

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# planar_functions.cc
# Opt level: O0

void SetPlane(uint8_t *dst_y,int dst_stride_y,int width,int height,uint32_t value)

{
  int iVar1;
  int in_ECX;
  uint in_EDX;
  uint in_ESI;
  long in_RDI;
  undefined4 in_R8D;
  _func_void_uint8_t_ptr_uint8_t_int *SetRow;
  int y;
  code *local_28;
  int in_stack_ffffffffffffffe4;
  int local_14;
  uint local_10;
  uint local_c;
  long local_8;
  
  local_28 = SetRow_C;
  local_14 = in_ECX;
  local_c = in_ESI;
  local_8 = in_RDI;
  if (in_ECX < 0) {
    local_14 = -in_ECX;
    local_8 = in_RDI + (int)((local_14 + -1) * in_ESI);
    local_c = -in_ESI;
  }
  local_10 = in_EDX;
  if (local_c == in_EDX) {
    local_10 = local_14 * in_EDX;
    local_14 = 1;
    local_c = 0;
  }
  iVar1 = libyuv::TestCpuFlag(in_stack_ffffffffffffffe4);
  if ((iVar1 != 0) && (local_28 = SetRow_Any_X86, (local_10 & 3) == 0)) {
    local_28 = SetRow_X86;
  }
  iVar1 = libyuv::TestCpuFlag(in_stack_ffffffffffffffe4);
  if (iVar1 != 0) {
    local_28 = SetRow_ERMS;
  }
  for (iVar1 = 0; iVar1 < local_14; iVar1 = iVar1 + 1) {
    (*local_28)(local_8,(char)in_R8D,local_10,in_R8D);
    local_8 = local_8 + (int)local_c;
  }
  return;
}

Assistant:

LIBYUV_API
void SetPlane(uint8_t* dst_y,
              int dst_stride_y,
              int width,
              int height,
              uint32_t value) {
  int y;
  void (*SetRow)(uint8_t * dst, uint8_t value, int width) = SetRow_C;
  if (height < 0) {
    height = -height;
    dst_y = dst_y + (height - 1) * dst_stride_y;
    dst_stride_y = -dst_stride_y;
  }
  // Coalesce rows.
  if (dst_stride_y == width) {
    width *= height;
    height = 1;
    dst_stride_y = 0;
  }
#if defined(HAS_SETROW_NEON)
  if (TestCpuFlag(kCpuHasNEON)) {
    SetRow = SetRow_Any_NEON;
    if (IS_ALIGNED(width, 16)) {
      SetRow = SetRow_NEON;
    }
  }
#endif
#if defined(HAS_SETROW_X86)
  if (TestCpuFlag(kCpuHasX86)) {
    SetRow = SetRow_Any_X86;
    if (IS_ALIGNED(width, 4)) {
      SetRow = SetRow_X86;
    }
  }
#endif
#if defined(HAS_SETROW_ERMS)
  if (TestCpuFlag(kCpuHasERMS)) {
    SetRow = SetRow_ERMS;
  }
#endif
#if defined(HAS_SETROW_MSA)
  if (TestCpuFlag(kCpuHasMSA) && IS_ALIGNED(width, 16)) {
    SetRow = SetRow_MSA;
  }
#endif

  // Set plane
  for (y = 0; y < height; ++y) {
    SetRow(dst_y, value, width);
    dst_y += dst_stride_y;
  }
}